

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsMetaDataSetString(FmsMetaData mdata,char *mdata_name,char *c_string)

{
  int iVar1;
  int iVar2;
  char *in_RAX;
  size_t sVar3;
  char *md_data;
  
  if (mdata == (FmsMetaData)0x0) {
    iVar1 = 1;
  }
  else {
    md_data = in_RAX;
    iVar1 = FmsMetaDataClear(mdata);
    if (iVar1 == 0) {
      iVar2 = FmsCopyString(c_string,&md_data);
      iVar1 = 2;
      if (iVar2 == 0) {
        iVar2 = FmsCopyString(mdata_name,&mdata->name);
        if (iVar2 == 0) {
          mdata->md_type = FMS_STRING;
          iVar1 = 0;
          if (md_data == (char *)0x0) {
            sVar3 = 0;
          }
          else {
            sVar3 = strlen(md_data);
          }
          mdata->num_entries = sVar3;
          mdata->data = md_data;
        }
        else {
          free(md_data);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int FmsMetaDataSetString(FmsMetaData mdata, const char *mdata_name,
                         const char *c_string) {
  if (!mdata) { E_RETURN(1); }
  int err = FmsMetaDataClear(mdata);
  if (err) { E_RETURN(err); }
  char *md_data;
  if (FmsCopyString(c_string, &md_data)) { E_RETURN(2); }
  // On error, call free(md_data)
  // Update mdata
  if (FmsCopyString(mdata_name, &mdata->name)) { free(md_data); E_RETURN(2); }
  mdata->md_type = FMS_STRING;
  mdata->num_entries = md_data ? strlen(md_data) : 0;
  mdata->data = md_data;
  return 0;
}